

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O2

size_t __thiscall std::hash<QSymbol>::operator()(hash<QSymbol> *this,QSymbol *q)

{
  ulong uVar1;
  
  uVar1 = (q->symbol).val.num * -0x395b586ca42e166b;
  uVar1 = ((uVar1 >> 0x2f ^ uVar1) * -0x395b586ca42e166b ^ 0xb160ea8090f805ba) * -0x395b586ca42e166b
  ;
  uVar1 = (uVar1 >> 0x2f ^ uVar1) * -0x395b586ca42e166b;
  return uVar1 >> 0x2f ^ uVar1;
}

Assistant:

size_t operator()(const QSymbol& q) const {
		uint64_t k = q.symbol.val.num;
		const uint64_t m = 0xc6a4a7935bd1e995;
		const int r = 47;
		uint64_t h = 0x8445d61a4e774912 ^ (8*m);
		k *= m;
		k ^= k >> r;
		k *= m;
		h ^= k;
		h *= m;
		h ^= h >> r;
		h *= m;
		h ^= h >> r;
		return h;
	}